

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

bool __thiscall
testing::internal::OnCallSpec<int_(int,_int,_int)>::Matches
          (OnCallSpec<int_(int,_int,_int)> *this,ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<3ul>::
          Matches<std::tuple<testing::Matcher<int>,testing::Matcher<int>,testing::Matcher<int>>,std::tuple<int,int,int>>
                    ((tuple<testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<int>_> *)
                     (this + 0x10),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<int,_int,_int>_&>::Matches
                      ((MatcherBase<const_std::tuple<int,_int,_int>_&> *)(this + 0x58),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }